

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O2

void __thiscall Am_Inter_Location_Data::Print(Am_Inter_Location_Data *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  std::operator<<(os,"(");
  if (this->as_line == true) {
    poVar2 = (ostream *)std::ostream::operator<<(os,(this->data).rect.left);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).rect.top);
    pcVar3 = ").(";
  }
  else {
    bVar1 = this->growing;
    poVar2 = (ostream *)std::ostream::operator<<(os,(this->data).rect.left);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).rect.top);
    if (bVar1 != true) goto LAB_001bff38;
    pcVar3 = ",";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).rect.width);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).rect.height);
LAB_001bff38:
  std::operator<<(poVar2,")");
  poVar2 = std::operator<<(os," w.r.t. ");
  ::operator<<(poVar2,&this->ref_obj);
  return;
}

Assistant:

void
Am_Inter_Location_Data::Print(std::ostream &os) const
{
  os << "(";
  if (as_line) {
    os << data.line.x1 << "," << data.line.y1 << ").(" << data.line.x2 << ","
       << data.line.y2 << ")";
  } else if (growing)
    os << data.rect.left << "," << data.rect.top << "," << data.rect.width
       << "," << data.rect.height << ")";
  else
    os << data.rect.left << "," << data.rect.top << ")";
  os << " w.r.t. " << ref_obj;
}